

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sandbox.cpp
# Opt level: O1

void __thiscall Sandbox::onFileChange(Sandbox *this,WatchFileList *_files,int index)

{
  _Rb_tree_header *p_Var1;
  pointer pWVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  int iVar5;
  _Base_ptr p_Var6;
  ostream *poVar7;
  long *plVar8;
  FileType FVar9;
  long *plVar10;
  string filename;
  anon_class_8_1_bc207785 dependency_matches_filename;
  long *local_f0 [2];
  long local_e0 [2];
  long *local_d0;
  string local_c8;
  pointer local_a8;
  Sandbox *local_a0;
  long *local_98;
  size_t local_90;
  long local_88 [2];
  long *local_78;
  size_t local_70;
  long local_68 [2];
  anon_class_8_1_bc207785 local_58;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  
  pWVar2 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
           super__Vector_impl_data._M_start;
  FVar9 = pWVar2[index].type;
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  _Var3._M_p = pWVar2[index].path._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,_Var3._M_p,_Var3._M_p + pWVar2[index].path._M_string_length);
  local_58.filename = &local_c8;
  if (FVar9 == GLSL_DEPENDENCY) {
    bVar4 = onFileChange::anon_class_8_1_bc207785::operator()(&local_58,&this->m_frag_dependencies);
    if (bVar4) {
      pWVar2 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
               super__Vector_impl_data._M_start;
      _Var3._M_p = pWVar2[this->frag_index].path._M_dataplus._M_p;
      local_f0[0] = local_e0;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_f0,_Var3._M_p,
                 _Var3._M_p + pWVar2[this->frag_index].path._M_string_length);
      local_d0 = (long *)((ulong)local_d0 & 0xffffffff00000000);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)local_f0);
      if (local_f0[0] != local_e0) {
        operator_delete(local_f0[0],local_e0[0] + 1);
      }
      FVar9 = FRAG_SHADER;
    }
    else {
      bVar4 = onFileChange::anon_class_8_1_bc207785::operator()
                        (&local_58,&this->m_vert_dependencies);
      if (bVar4) {
        pWVar2 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        _Var3._M_p = pWVar2[this->vert_index].path._M_dataplus._M_p;
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,_Var3._M_p,
                   _Var3._M_p + pWVar2[this->vert_index].path._M_string_length);
        local_d0 = (long *)CONCAT44(local_d0._4_4_,1);
        std::__cxx11::string::operator=((string *)&local_c8,(string *)local_f0);
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
        FVar9 = VERT_SHADER;
      }
    }
  }
  switch(FVar9) {
  case FRAG_SHADER:
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_frag_source,0,(char *)(this->m_frag_source)._M_string_length,0x3194fe
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->m_frag_dependencies,
                      (this->m_frag_dependencies).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    bVar4 = vera::loadGlslFrom(&local_c8,&this->m_frag_source,&this->include_folders,
                               &this->m_frag_dependencies);
    break;
  case VERT_SHADER:
    std::__cxx11::string::_M_replace
              ((ulong)&this->m_vert_source,0,(char *)(this->m_vert_source)._M_string_length,0x3194fe
              );
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->m_vert_dependencies,
                      (this->m_vert_dependencies).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    bVar4 = vera::loadGlslFrom(&local_c8,&this->m_vert_source,&this->include_folders,
                               &this->m_vert_dependencies);
    break;
  case IMAGE:
    local_78 = local_68;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,local_c8._M_dataplus._M_p,
               local_c8._M_dataplus._M_p + local_c8._M_string_length);
    local_a8 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
               super__Vector_impl_data._M_start;
    p_Var6 = *(_Base_ptr *)
              ((long)&(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    p_Var1 = &(this->uniforms).super_Scene.textures._M_t._M_impl.super__Rb_tree_header;
    local_a0 = this;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        local_d0 = *(long **)(p_Var6 + 2);
        (**(code **)(*local_d0 + 0x58))(&local_50);
        if (local_70 == local_48) {
          if (local_70 == 0) {
            bVar4 = true;
          }
          else {
            iVar5 = bcmp(local_78,local_50,local_70);
            bVar4 = iVar5 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
      } while ((!bVar4) &&
              (p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6),
              (_Rb_tree_header *)p_Var6 != p_Var1));
    }
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reloading",9);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_78,local_70);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      (**(code **)(**(long **)(p_Var6 + 2) + 0x20))
                (*(long **)(p_Var6 + 2),&local_78,local_a8[index].vFlip,0,0);
    }
    plVar8 = local_68;
    plVar10 = local_78;
    goto LAB_001c06bb;
  default:
    goto switchD_001c02be_caseD_3;
  case CUBEMAP:
    local_98 = local_88;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,local_c8._M_dataplus._M_p,
               local_c8._M_dataplus._M_p + local_c8._M_string_length);
    local_a8 = (_files->super__Vector_base<WatchFile,_std::allocator<WatchFile>_>)._M_impl.
               super__Vector_impl_data._M_start;
    p_Var6 = *(_Base_ptr *)
              ((long)&(this->uniforms).super_Scene.cubemaps._M_t._M_impl.super__Rb_tree_header.
                      _M_header + 0x10);
    p_Var1 = &(this->uniforms).super_Scene.cubemaps._M_t._M_impl.super__Rb_tree_header;
    local_a0 = this;
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      do {
        local_f0[0] = local_e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_f0,*(long *)(p_Var6 + 1),
                   (long)&(p_Var6[1]._M_parent)->_M_color + *(long *)(p_Var6 + 1));
        local_d0 = *(long **)(p_Var6 + 2);
        (**(code **)(*local_d0 + 0x58))(&local_50);
        if (local_90 == local_48) {
          if (local_90 == 0) {
            bVar4 = true;
          }
          else {
            iVar5 = bcmp(local_98,local_50,local_90);
            bVar4 = iVar5 == 0;
          }
        }
        else {
          bVar4 = false;
        }
        if (local_50 != local_40) {
          operator_delete(local_50,local_40[0] + 1);
        }
        if (local_f0[0] != local_e0) {
          operator_delete(local_f0[0],local_e0[0] + 1);
        }
      } while ((!bVar4) &&
              (p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6),
              (_Rb_tree_header *)p_Var6 != p_Var1));
    }
    if ((_Rb_tree_header *)p_Var6 != p_Var1) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Reloading",9);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)local_98,local_90);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      (**(code **)(**(long **)(p_Var6 + 2) + 0x88))
                (*(long **)(p_Var6 + 2),&local_98,local_a8[index].vFlip);
    }
    plVar8 = local_88;
    plVar10 = local_98;
LAB_001c06bb:
    this = local_a0;
    if (plVar10 != plVar8) {
      operator_delete(plVar10,*plVar8 + 1);
    }
    goto switchD_001c02be_caseD_3;
  }
  if (bVar4 != false) {
    resetShaders(this,_files);
  }
switchD_001c02be_caseD_3:
  this->m_change = true;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Sandbox::onFileChange(WatchFileList &_files, int index) {
    FileType type = _files[index].type;
    std::string filename = _files[index].path;

    const auto reset_shaders = [&](std::string& source, vera::StringList& dependencies){
        source = "";
        dependencies.clear();
        if ( vera::loadGlslFrom(filename, &source, include_folders, &dependencies) )
            resetShaders(_files);
    };

    const auto dependency_matches_filename = [&](const vera::StringList& dependencies) {
        return std::any_of(std::begin(dependencies), std::end(dependencies), [&](const std::string& dependency){ return dependency == filename; });
    };

    // IF the change is on a dependency file, re route to the correct shader that need to be reload
    if (type == GLSL_DEPENDENCY) {
        using kv = std::tuple<FileType, std::string>;
        if (dependency_matches_filename(m_frag_dependencies)){
            std::tie(type, filename) = kv{FRAG_SHADER, _files[frag_index].path};
        } else if (dependency_matches_filename(m_vert_dependencies)){
            std::tie(type, filename) = kv{VERT_SHADER, _files[vert_index].path};
        }
    }
    switch(type) {
    case FRAG_SHADER:
        reset_shaders(m_frag_source, m_frag_dependencies);
        break;
    case VERT_SHADER:
        reset_shaders(m_vert_source, m_vert_dependencies);
        break;
    case GEOMETRY:
        // TODO
        break;
    case IMAGE:
        reload_uniforms(uniforms.textures, filename, _files[index]);
        break;
    case CUBEMAP:
        reload_uniforms(uniforms.cubemaps, filename, _files[index]);
        break;
    default: //'GLSL_DEPENDENCY' and 'IMAGE_BUMPMAP' not handled in switch
        break;
    }
    flagChange();
}